

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trackable_ptr_extensions.cpp
# Opt level: O0

void __thiscall test_trackable_base::I::I(I *this,I *param_1)

{
  I *param_1_local;
  I *this_local;
  
  tower120::trackable_base::trackable_base
            (&this->super_trackable_base,&param_1->super_trackable_base);
  this->i = param_1->i;
  return;
}

Assistant:

void test_trackable_base(){
    struct I : trackable_base {
        int i;
        I(int i) : i(i) {}
    };

    std::vector<I> vec;
    vec.emplace_back(1);
    trackable_ptr<I> p{&vec.front()};
    REQUIRE(p->i == 1);

    for(int i=2;i<1000;++i){
        vec.emplace_back(i);
    }
    REQUIRE(p->i == 1);

    REQUIRE(p.get() == &vec.front());
    std::iter_swap(get_iterator(vec, p), std::prev(vec.end()));
    REQUIRE(p.get() == &vec.back());
    REQUIRE(p->i == 1);
}